

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O0

void Am_Print_Key(ostream *os,Am_Slot_Key key)

{
  char *pcVar1;
  ostream *poVar2;
  char *name;
  Am_Slot_Key key_local;
  ostream *os_local;
  
  std::operator<<(os,"<");
  pcVar1 = Am_Get_Slot_Name(key);
  if (pcVar1 == (char *)0x0) {
    std::operator<<(os,"unnamed");
  }
  else {
    std::operator<<(os,pcVar1);
  }
  poVar2 = std::operator<<(os,"[");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(uint)key);
  std::operator<<(poVar2,"]>");
  return;
}

Assistant:

void
Am_Print_Key(std::ostream &os, Am_Slot_Key key)
{
  os << "<";
  const char *name = Am_Get_Slot_Name(key);
  if (name)
    os << name;
  else
    os << "unnamed";
  os << "[" << (int)key << "]>";
}